

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_list(void)

{
  bool bVar1;
  bool bVar2;
  tc_toktyp_t tVar3;
  int iVar4;
  uint uVar5;
  CTcTokenizer *this;
  CTcPrsNode *pCVar6;
  CTcPrsNode *ele;
  CTPNList *lst;
  CTcConstVal nilval;
  int at_def_val;
  int is_lookup_table;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  CTcTokenizer *in_stack_ffffffffffffff50;
  CTcGenTarg *this_00;
  CTcTokenizer *in_stack_ffffffffffffff58;
  CTcTokenizer *in_stack_ffffffffffffff68;
  CTPNListBase *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffffd8;
  
  bVar1 = false;
  bVar2 = false;
  CTcConstVal::CTcConstVal((CTcConstVal *)&stack0xffffffffffffffc8);
  CTcConstVal::set_nil((CTcConstVal *)&stack0xffffffffffffffc8);
  CTcTokenizer::next(in_stack_ffffffffffffff58);
  this = (CTcTokenizer *)CTcPrsAllocObj::operator_new(0x259b32);
  this->last_linenum_ = 0;
  this->appended_desc_ = (CTcTokFileDesc *)0x0;
  this->incpath_tail_ = (tctok_incpath_t *)0x0;
  this->last_desc_ = (CTcTokFileDesc *)0x0;
  *(undefined8 *)&this->prev_includes_ = 0;
  ((anon_union_24_10_6f92a4ee_for_val_ *)&this->incpath_head_)->intval_ = 0;
  this->default_charset_ = (char *)0x0;
  this->default_mapper_ = (CCharmapToUni *)0x0;
  *(undefined8 *)this = 0;
  this->res_loader_ = (CResLoader *)0x0;
  CTPNList::CTPNList((CTPNList *)in_stack_ffffffffffffff50);
  do {
    tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x259b73);
    switch(tVar3) {
    case TOKT_EOF:
    case TOKT_DSTR_MID:
    case TOKT_DSTR_END:
    case TOKT_RBRACE:
    case TOKT_SEM:
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      goto LAB_0025a04b;
    case TOKT_RPAR:
      CTcTokenizer::log_error(0x2b0d);
      CTcTokenizer::next(in_stack_ffffffffffffff58);
      break;
    case TOKT_RBRACK:
      CTcTokenizer::next(in_stack_ffffffffffffff58);
      goto LAB_0025a04b;
    case TOKT_TIMES:
      tVar3 = CTcTokenizer::next(in_stack_ffffffffffffff58);
      if (tVar3 == TOKT_ARROW) {
        CTcTokenizer::next(in_stack_ffffffffffffff58);
        if ((bVar1) || (iVar4 = CTPNListBase::get_count((CTPNListBase *)this), iVar4 == 0)) {
          bVar1 = true;
          bVar2 = true;
        }
        else {
          uVar5 = CTPNListBase::get_count((CTPNListBase *)this);
          CTcTokenizer::log_error(0x2bd3,(ulong)uVar5);
        }
      }
      else {
        CTcTokenizer::unget((CTcTokenizer *)0x259c87);
      }
    default:
    }
    pCVar6 = CTcPrsOpAsi::parse((CTcPrsOpAsi *)in_stack_ffffffffffffffd8);
    if (pCVar6 == (CTcPrsNode *)0x0) {
      return (CTcPrsNode *)0x0;
    }
    CTPNListBase::add_element(in_stack_ffffffffffffff70,(CTcPrsNode *)in_stack_ffffffffffffff68);
    if ((bVar2) && (tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x259ce1), tVar3 != TOKT_RBRACK)) {
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      bVar2 = false;
      tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x259d18);
      if (tVar3 == TOKT_COMMA) {
        CTcPrsAllocObj::operator_new(0x259d31);
        CTPNConst::CTPNConst
                  ((CTPNConst *)in_stack_ffffffffffffff50,
                   (CTcConstVal *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        CTPNListBase::add_element(in_stack_ffffffffffffff70,(CTcPrsNode *)in_stack_ffffffffffffff68)
        ;
      }
    }
    tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x259d8f);
    switch(tVar3) {
    case TOKT_EOF:
    case TOKT_DSTR_MID:
    case TOKT_DSTR_END:
    case TOKT_LBRACE:
    case TOKT_RBRACE:
    case TOKT_SEM:
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      goto LAB_0025a04b;
    default:
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x25a03d);
      if (tVar3 == TOKT_EOF) goto LAB_0025a04b;
      break;
    case TOKT_COMMA:
      CTcTokenizer::next(in_stack_ffffffffffffff58);
      if ((bVar1) && (uVar5 = CTPNListBase::get_count((CTPNListBase *)this), (uVar5 & 1) != 0)) {
        iVar4 = CTPNListBase::get_count((CTPNListBase *)this);
        CTcTokenizer::log_error(0x2bd2,(ulong)(uint)((iVar4 + 1) - (iVar4 + 1 >> 0x1f) >> 1));
        in_stack_ffffffffffffff68 = this;
        in_stack_ffffffffffffff70 = (CTPNListBase *)CTcPrsAllocObj::operator_new(0x259e27);
        CTPNConst::CTPNConst
                  ((CTPNConst *)in_stack_ffffffffffffff50,
                   (CTcConstVal *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        CTPNListBase::add_element(in_stack_ffffffffffffff70,(CTcPrsNode *)in_stack_ffffffffffffff68)
        ;
      }
      tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x259e83);
      if (tVar3 == TOKT_RBRACK) {
        CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
LAB_0025a04b:
        this_00 = G_cg;
        CTPNListBase::get_count((CTPNListBase *)this);
        CTcGenTarg::note_list(this_00,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
        ;
        if (bVar1) {
          CTPNListBase::set_lookup_table((CTPNListBase *)this);
        }
        return (CTcPrsNode *)this;
      }
      break;
    case TOKT_RBRACK:
      CTcTokenizer::next(in_stack_ffffffffffffff58);
      if (((bVar1) && (uVar5 = CTPNListBase::get_count((CTPNListBase *)this), (uVar5 & 1) != 0)) &&
         (!bVar2)) {
        iVar4 = CTPNListBase::get_count((CTPNListBase *)this);
        CTcTokenizer::log_error
                  (0x2bd2,(long)(iVar4 + 1) / 2 & 0xffffffff,(long)(iVar4 + 1) % 2 & 0xffffffff);
      }
      goto LAB_0025a04b;
    case TOKT_ARROW:
      CTcTokenizer::next(in_stack_ffffffffffffff58);
      iVar4 = CTPNListBase::get_count((CTPNListBase *)this);
      if (iVar4 == 1) {
        bVar1 = true;
      }
      else if (bVar1) {
        if ((bVar1) && (uVar5 = CTPNListBase::get_count((CTPNListBase *)this), (uVar5 & 1) == 0)) {
          iVar4 = CTPNListBase::get_count((CTPNListBase *)this);
          CTcTokenizer::log_error(0x2bd4,(ulong)(uint)(iVar4 / 2));
          in_stack_ffffffffffffff58 = this;
          CTcPrsAllocObj::operator_new(0x259f54);
          CTPNConst::CTPNConst
                    ((CTPNConst *)in_stack_ffffffffffffff50,
                     (CTcConstVal *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          CTPNListBase::add_element
                    (in_stack_ffffffffffffff70,(CTcPrsNode *)in_stack_ffffffffffffff68);
        }
      }
      else {
        uVar5 = CTPNListBase::get_count((CTPNListBase *)this);
        CTcTokenizer::log_error(0x2bd3,(ulong)uVar5);
      }
    }
  } while( true );
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_list()
{
    /* assume this isn't a lookup table (with "key->val" pairs) */
    int is_lookup_table = FALSE;

    /* we're not at the default value for a lookup table ("*->val") */
    int at_def_val = FALSE;

    /* set up a nil value for adding placeholders (for error recovery) */
    CTcConstVal nilval;
    nilval.set_nil();
    
    /* skip the opening '[' */
    G_tok->next();

    /* 
     *   create the list expression -- we'll add elements to the list as
     *   we parse the elements
     */
    CTPNList *lst = new CTPNList();

    /* scan all list elements */
    for (;;)
    {
        /* check what we have */
        switch(G_tok->cur())
        {
        case TOKT_RBRACK:
            /* 
             *   that's the end of the list - skip the closing bracket and
             *   return the finished list 
             */
            G_tok->next();
            goto done;
            
        case TOKT_EOF:
        case TOKT_RBRACE:
        case TOKT_SEM:
        case TOKT_DSTR_MID:
        case TOKT_DSTR_END:
            /* 
             *   these would all seem to imply that the closing ']' was
             *   missing from the list; flag the error and end the list
             *   now 
             */
            G_tok->log_error_curtok(TCERR_LIST_MISSING_RBRACK);
            goto done;

        case TOKT_RPAR:
            /* 
             *   extra right paren - log an error, but then skip the paren
             *   and try to keep parsing
             */
            G_tok->log_error(TCERR_LIST_EXTRA_RPAR);
            G_tok->next();
            break;

        case TOKT_TIMES:
            /*
             *   If a -> follows, this is the default value for a lookup
             *   table list. 
             */
            if (G_tok->next() == TOKT_ARROW)
            {
                /* skip the arrow and get to the value */
                G_tok->next();

                /* 
                 *   if this is a non-lookup table list with other entries,
                 *   this is an error 
                 */
                if (!is_lookup_table && lst->get_count() != 0)
                {
                    /* log the error, but keep parsing the list */
                    G_tok->log_error(TCERR_ARROW_IN_LIST, lst->get_count());
                }
                else
                {
                    /* it's definitely a lookup list now */
                    is_lookup_table = TRUE;

                    /* we're now on the default value */
                    at_def_val = TRUE;
                }
            }
            else
            {
                /* it's not *-> - put back the next token */
                G_tok->unget();
            }

        default:
            /* it must be the next element expression */
            break;
        }

        /* 
         *   Attempt to parse another list element expression.  Parse just
         *   below a comma expression, because commas can be used to
         *   separate list elements.  
         */
        CTcPrsNode *ele = S_op_asi.parse();
        if (ele == 0)
            return 0;
        
        /* add the element to the list */
        lst->add_element(ele);

        /* if this was the default value, the list should end here */
        if (at_def_val && G_tok->cur() != TOKT_RBRACK)
        {
            /* log an error */
            G_tok->log_error_curtok(TCERR_LOOKUP_LIST_EXPECTED_END_AT_DEF);

            /* we've left the default value */
            at_def_val = FALSE;

            /* 
             *   if we're at a comma, add a nil value to the list to
             *   resynchronize - they must want to add more Key->Value pairs 
             */
            if (G_tok->cur() == TOKT_COMMA)
                lst->add_element(new CTPNConst(&nilval));
        }

        /* check what follows the element */
        switch(G_tok->cur())
        {
        case TOKT_COMMA:
            /* skip the comma introducing the next element */
            G_tok->next();

            /*
             *   If this is a lookup table list, commas are only allowed at
             *   even elements: [ODD -> EVEN, ODD -> EVEN...].
             */
            if (is_lookup_table && (lst->get_count() & 1) != 0)
            {
                /* log an error */
                G_tok->log_error(TCERR_LOOKUP_LIST_EXPECTED_ARROW,
                                 (lst->get_count()+1)/2);

                /* 
                 *   Add an implied nil element as the value.  This will help
                 *   resynchronize with the source code in the most likely
                 *   case that they simply left out a ->value item, so that
                 *   we don't log alternating "expected comma" and "expected
                 *   arrow" messages on every subsequent delimiter.  
                 */
                lst->add_element(new CTPNConst(&nilval));
            }

            /* if a close bracket follows, we seem to have an extra comma */
            if (G_tok->cur() == TOKT_RBRACK)
            {
                /* 
                 *   log an error about the missing element, then end the
                 *   list here 
                 */
                G_tok->log_error_curtok(TCERR_LIST_EXPECT_ELEMENT);
                goto done;
            }
            break;

        case TOKT_ARROW:
            /* skip the arrow */
            G_tok->next();

            /* 
             *   '->' indicates a lookup table key->value list.  This is an
             *   all-or-nothing proposition: it has to be on every pair of
             *   elements, or on none of them.
             */
            if (lst->get_count() == 1)
            {
                /* first element: this is now a lookup table list */
                is_lookup_table = TRUE;
            }
            else if (!is_lookup_table)
            {
                /* 
                 *   it's not the first element, and we haven't seen arrows
                 *   before, so this list shouldn't have arrows at all 
                 */
                G_tok->log_error(TCERR_ARROW_IN_LIST, lst->get_count());
            }
            else if (is_lookup_table && (lst->get_count() & 1) == 0)
            {
                /*
                 *   We have an even number of elements, so an arrow is not
                 *   allowed here under any circumstances. 
                 */
                G_tok->log_error(TCERR_MISPLACED_ARROW_IN_LIST,
                                 lst->get_count()/2);

                /* 
                 *   They probably just left out the key value accidentally,
                 *   so add a nil value as the key.  This will avoid a
                 *   cascade of errors for subsequent delimiters if they did
                 *   just leave out one item. 
                 */
                lst->add_element(new CTPNConst(&nilval));
            }
            break;

        case TOKT_RBRACK:
            /* 
             *   we're done with the list - skip the bracket and return
             *   the finished list 
             */
            G_tok->next();

            /* 
             *   If this is a lookup table list, make sure we ended on an
             *   even number - if not, we're missing a ->Value entry.  The
             *   exception is that if the last value was a default, we end on
             *   an odd item.  
             */
            if (is_lookup_table
                && (lst->get_count() & 1) != 0
                && !at_def_val)
            {
                /* log the error */
                G_tok->log_error(TCERR_LOOKUP_LIST_EXPECTED_ARROW,
                                 (lst->get_count()+1)/2);
            }
            goto done;

        case TOKT_EOF:
        case TOKT_LBRACE:
        case TOKT_RBRACE:
        case TOKT_SEM:
        case TOKT_DSTR_MID:
        case TOKT_DSTR_END:
            /* 
             *   these would all seem to imply that the closing ']' was
             *   missing from the list; flag the error and end the list
             *   now 
             */
            G_tok->log_error_curtok(TCERR_LIST_MISSING_RBRACK);
            goto done;

        default:
            /* 
             *   Anything else is an error - note that we expected a
             *   comma, then proceed with parsing from the current token
             *   as though we had found the comma (in all likelihood, the
             *   comma was accidentally omitted).  If we've reached the
             *   end of the file, return what we have so far, since it's
             *   pointless to keep looping.  
             */
            G_tok->log_error_curtok(TCERR_LIST_EXPECT_COMMA);

            /* give up on end of file, otherwise keep going */
            if (G_tok->cur() == TOKT_EOF)
                goto done;
            break;
        }
    }

done:
    /* tell the parser to note this list, in case it's the longest yet */
    G_cg->note_list(lst->get_count());

    /* if it's a lookup table list, mark it as such */
    if (is_lookup_table)
        lst->set_lookup_table();

    /* return the list */
    return lst;
}